

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O1

void __thiscall xe::TestSet::addGroup(TestSet *this,TestGroup *testGroup)

{
  TestGroup *local_20;
  
  local_20 = testGroup;
  if (testGroup != (TestGroup *)0x0) {
    do {
      std::
      _Rb_tree<xe::TestNode_const*,xe::TestNode_const*,std::_Identity<xe::TestNode_const*>,std::less<xe::TestNode_const*>,std::allocator<xe::TestNode_const*>>
      ::_M_insert_unique<xe::TestNode_const*const&>
                ((_Rb_tree<xe::TestNode_const*,xe::TestNode_const*,std::_Identity<xe::TestNode_const*>,std::less<xe::TestNode_const*>,std::allocator<xe::TestNode_const*>>
                  *)this,(TestNode **)&local_20);
      local_20 = (local_20->super_TestNode).m_parent;
    } while (local_20 != (TestGroup *)0x0);
  }
  addChildren(&this->m_set,testGroup);
  return;
}

Assistant:

void TestSet::addGroup (const TestGroup* testGroup)
{
	addNodeAndParents(m_set, testGroup);
	addChildren(m_set, testGroup);
}